

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

PropertySymOpnd * __thiscall Inline::GetMethodLdOpndForCallInstr(Inline *this,Instr *callInstr)

{
  bool bVar1;
  Opnd *pOVar2;
  RegOpnd *pRVar3;
  StackSym *pSVar4;
  Instr *this_00;
  SymOpnd *pSVar5;
  PropertySymOpnd *pPVar6;
  Instr *defInstr;
  Opnd *methodOpnd;
  Instr *callInstr_local;
  Inline *this_local;
  
  pOVar2 = IR::Instr::GetSrc1(callInstr);
  bVar1 = IR::Opnd::IsRegOpnd(pOVar2);
  if (bVar1) {
    pRVar3 = IR::Opnd::AsRegOpnd(pOVar2);
    bVar1 = Sym::IsStackSym(&pRVar3->m_sym->super_Sym);
    if (bVar1) {
      pRVar3 = IR::Opnd::AsRegOpnd(pOVar2);
      pSVar4 = Sym::AsStackSym(&pRVar3->m_sym->super_Sym);
      bVar1 = StackSym::IsSingleDef(pSVar4);
      if (bVar1) {
        pRVar3 = IR::Opnd::AsRegOpnd(pOVar2);
        pSVar4 = Sym::AsStackSym(&pRVar3->m_sym->super_Sym);
        this_00 = StackSym::GetInstrDef(pSVar4);
        pOVar2 = IR::Instr::GetSrc1(this_00);
        if (pOVar2 != (Opnd *)0x0) {
          pOVar2 = IR::Instr::GetSrc1(this_00);
          bVar1 = IR::Opnd::IsSymOpnd(pOVar2);
          if (bVar1) {
            pOVar2 = IR::Instr::GetSrc1(this_00);
            pSVar5 = IR::Opnd::AsSymOpnd(pOVar2);
            bVar1 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
            if (bVar1) {
              pOVar2 = IR::Instr::GetSrc1(this_00);
              pSVar5 = IR::Opnd::AsSymOpnd(pOVar2);
              pPVar6 = IR::Opnd::AsPropertySymOpnd(&pSVar5->super_Opnd);
              return pPVar6;
            }
          }
        }
      }
    }
  }
  return (PropertySymOpnd *)0x0;
}

Assistant:

IR::PropertySymOpnd*
Inline::GetMethodLdOpndForCallInstr(IR::Instr* callInstr)
{
    IR::Opnd* methodOpnd = callInstr->GetSrc1();
    if (methodOpnd->IsRegOpnd())
    {
        if (methodOpnd->AsRegOpnd()->m_sym->IsStackSym())
        {
            if (methodOpnd->AsRegOpnd()->m_sym->AsStackSym()->IsSingleDef())
            {
                IR::Instr* defInstr = methodOpnd->AsRegOpnd()->m_sym->AsStackSym()->GetInstrDef();
                if (defInstr->GetSrc1() && defInstr->GetSrc1()->IsSymOpnd() && defInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
                {
                    return defInstr->GetSrc1()->AsSymOpnd()->AsPropertySymOpnd();
                }
                return nullptr;
            }
            return nullptr;
        }
        return nullptr;
    }
    return nullptr;
}